

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O2

void setup_pred_plane(buf_2d *dst,BLOCK_SIZE bsize,uint8_t *src,int width,int height,int stride,
                     int mi_row,int mi_col,scale_factors *scale,int subsampling_x,int subsampling_y)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  uVar3 = (uint)((0x20005UL >> ((ulong)bsize & 0x3f) & 1) != 0);
  if (subsampling_y == 0) {
    uVar3 = 0;
  }
  uVar5 = (uint)((0x10003UL >> ((ulong)bsize & 0x3f) & 1) != 0);
  if (subsampling_x == 0) {
    uVar5 = 0;
  }
  iVar6 = (int)((~uVar5 & mi_col) << 2) >> ((byte)subsampling_x & 0x1f);
  iVar4 = (int)((~uVar3 & mi_row) << 2) >> ((byte)subsampling_y & 0x1f);
  if ((scale != (scale_factors *)0x0) && (iVar1 = av1_is_scaled(scale), iVar1 != 0)) {
    lVar2 = (long)(scale->x_scale_fp * 8 + -0x20000) + (long)iVar6 * (long)scale->x_scale_fp;
    if (lVar2 < 0) {
      iVar6 = -(int)((ulong)(0x80 - lVar2) >> 8);
    }
    else {
      iVar6 = (int)((ulong)(lVar2 + 0x80) >> 8);
    }
    lVar2 = (long)(scale->y_scale_fp * 8 + -0x20000) + (long)iVar4 * (long)scale->y_scale_fp;
    if (lVar2 < 0) {
      iVar4 = -(int)((ulong)(0x80 - lVar2) >> 8);
    }
    else {
      iVar4 = (int)((ulong)(lVar2 + 0x80) >> 8);
    }
    iVar6 = iVar6 >> 6;
    iVar4 = iVar4 >> 6;
  }
  dst->buf = src + (long)iVar4 * (long)stride + (long)iVar6;
  dst->buf0 = src;
  dst->width = width;
  dst->height = height;
  dst->stride = stride;
  return;
}

Assistant:

static inline void setup_pred_plane(struct buf_2d *dst, BLOCK_SIZE bsize,
                                    uint8_t *src, int width, int height,
                                    int stride, int mi_row, int mi_col,
                                    const struct scale_factors *scale,
                                    int subsampling_x, int subsampling_y) {
  // Offset the buffer pointer
  if (subsampling_y && (mi_row & 0x01) && (mi_size_high[bsize] == 1))
    mi_row -= 1;
  if (subsampling_x && (mi_col & 0x01) && (mi_size_wide[bsize] == 1))
    mi_col -= 1;

  const int x = (MI_SIZE * mi_col) >> subsampling_x;
  const int y = (MI_SIZE * mi_row) >> subsampling_y;
  dst->buf = src + scaled_buffer_offset(x, y, stride, scale);
  dst->buf0 = src;
  dst->width = width;
  dst->height = height;
  dst->stride = stride;
}